

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O1

void Acb_ObjRemoveDup(Acb_Ntk_t *p,int iObj,int i,int j)

{
  int *piVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  uint uVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  int *piVar10;
  char *__assertion;
  long lVar11;
  ulong uVar12;
  int *pFanins;
  word *pwVar13;
  ulong uVar14;
  bool bVar15;
  
  if (iObj < 1) {
    __assertion = "i>0";
  }
  else {
    iVar7 = (p->vObjTruth).nSize;
    if (0 < iVar7) {
      if (iVar7 <= iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if ((p->vObjType).nSize <= iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if (0xfd < (byte)((p->vObjType).pArray[(uint)iObj] - 5U)) {
        __assert_fail("!Acb_ObjIsCio(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbPush.c"
                      ,0xad,"void Acb_ObjRemoveDup(Acb_Ntk_t *, int, int, int)");
      }
      if (iObj < (p->vObjFans).nSize) {
        piVar10 = (p->vObjFans).pArray;
        iVar7 = piVar10[(uint)iObj];
        if ((-1 < (long)iVar7) && (iVar7 < (p->vFanSto).nSize)) {
          piVar1 = (p->vFanSto).pArray;
          piVar3 = piVar1 + iVar7;
          lVar11 = (long)j;
          if (piVar3[(long)i + 1] != piVar3[lVar11 + 1]) {
            __assert_fail("Acb_ObjFanin(p, iObj, i) == Acb_ObjFanin(p, iObj, j)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbPush.c"
                          ,0xae,"void Acb_ObjRemoveDup(Acb_Ntk_t *, int, int, int)");
          }
          if ((5 < (uint)i) || (5 < (uint)j)) {
            __assert_fail("iVar >= 0 && iVar < 6",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x337,"word Abc_Tt6Cofactor0(word, int)");
          }
          uVar14 = (p->vObjTruth).pArray[(uint)iObj];
          uVar12 = s_Truths6Neg[(uint)i] & uVar14;
          bVar5 = (byte)(1 << ((byte)i & 0x1f));
          uVar12 = (uVar12 << (bVar5 & 0x3f) | uVar12) & s_Truths6Neg[(uint)j];
          bVar6 = (byte)(1 << ((byte)j & 0x1f));
          uVar14 = uVar14 & s_Truths6[(uint)i];
          uVar14 = (uVar14 >> (bVar5 & 0x3f) | uVar14) & s_Truths6[(uint)j];
          uVar12 = uVar12 << (bVar6 & 0x3f) | uVar12;
          uVar12 = ((uVar14 >> (bVar6 & 0x3f) | uVar14) ^ uVar12) & s_Truths6[i] ^ uVar12;
          if ((s_Truths6Neg[lVar11] & (uVar12 >> (bVar6 & 0x3f) ^ uVar12)) != 0) {
            __assert_fail("!Abc_Tt6HasVar(t, iVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x6cb,"word Abc_Tt6RemoveVar(word, int)");
          }
          if (j != 5) {
            pwVar13 = s_PMasks[lVar11] + 2;
            lVar8 = lVar11;
            iVar7 = j;
            do {
              lVar8 = lVar8 + 1;
              bVar5 = (byte)(1 << ((byte)iVar7 & 0x1f));
              uVar12 = (uVar12 & *pwVar13) >> (bVar5 & 0x3f) |
                       (pwVar13[-1] & uVar12) << (bVar5 & 0x3f) |
                       (*(word (*) [3])(pwVar13 + -2))[0] & uVar12;
              iVar7 = iVar7 + 1;
              pwVar13 = pwVar13 + 3;
            } while ((int)lVar8 != 5);
          }
          if ((p->vObjTruth).nSize <= iObj) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
          }
          (p->vObjTruth).pArray[(uint)iObj] = uVar12;
          iVar7 = *piVar3 + -1;
          *piVar3 = iVar7;
          lVar8 = lVar11;
          if (j < iVar7) {
            do {
              piVar3[lVar8 + 1] = piVar3[lVar8 + 2];
              lVar8 = lVar8 + 1;
              iVar7 = *piVar3;
            } while (lVar8 < iVar7);
          }
          piVar3[(long)iVar7 + 1] = -1;
          if ((p->vFanouts).nSize <= iObj) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          if ((p->vObjFans).nSize <= iObj) goto LAB_003a6e97;
          iVar7 = piVar10[(uint)iObj];
          if ((-1 < (long)iVar7) && (iVar7 < (p->vFanSto).nSize)) {
            pVVar2 = (p->vFanouts).pArray;
            uVar4 = pVVar2[(uint)iObj].nSize;
            uVar14 = 0;
            bVar15 = 0 < (int)uVar4;
            if (0 < (int)uVar4) {
              iVar7 = piVar1[(long)iVar7 + lVar11 + 1];
              bVar15 = true;
              if (*pVVar2[(uint)iObj].pArray != iVar7) {
                uVar12 = 0;
                do {
                  if ((ulong)uVar4 - 1 == uVar12) {
                    bVar15 = false;
                    uVar14 = (ulong)uVar4;
                    goto LAB_003a6dfc;
                  }
                  uVar14 = uVar12 + 1;
                  lVar11 = uVar12 + 1;
                  uVar12 = uVar14;
                } while (pVVar2[(uint)iObj].pArray[lVar11] != iVar7);
                bVar15 = uVar14 < uVar4;
              }
            }
LAB_003a6dfc:
            if ((uint)uVar14 != uVar4) {
              if (!bVar15) {
                __assert_fail("i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
              }
              uVar9 = (uint)uVar14 + 1;
              if ((int)uVar9 < (int)uVar4) {
                piVar3 = pVVar2[(uint)iObj].pArray;
                piVar10 = piVar3 + uVar9;
                do {
                  iVar7 = (int)uVar14;
                  piVar3[uVar14 & 0xffffffff] = *piVar10;
                  uVar4 = pVVar2[(uint)iObj].nSize;
                  piVar10 = piVar10 + 1;
                  uVar14 = (ulong)(iVar7 + 1);
                } while (iVar7 + 2 < (int)uVar4);
              }
              pVVar2[(uint)iObj].nSize = uVar4 - 1;
            }
            do {
              iVar7 = Acb_ObjSuppMin_int(p,iObj);
            } while (iVar7 != 0);
            return;
          }
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
LAB_003a6e97:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    __assertion = "Acb_NtkHasObjTruths(p)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
}

Assistant:

void Acb_ObjRemoveDup( Acb_Ntk_t * p, int iObj, int i, int j )
{
    word c00, c11, uTruthNew, uTruth = Acb_ObjTruth( p, iObj );
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( Acb_ObjFanin(p, iObj, i) == Acb_ObjFanin(p, iObj, j) );
    c00 = Abc_Tt6Cofactor0( Abc_Tt6Cofactor0(uTruth, i), j );
    c11 = Abc_Tt6Cofactor1( Abc_Tt6Cofactor1(uTruth, i), j );
    uTruthNew = (~s_Truths6[i] & c00) | (s_Truths6[i] & c11);
    Vec_WrdWriteEntry( &p->vObjTruth, iObj, Abc_Tt6RemoveVar(uTruthNew, j) );
    Acb_ObjDeleteFaninIndex( p, iObj, j );
    Vec_IntRemove( Vec_WecEntry(&p->vFanouts, iObj), Acb_ObjFanin(p, iObj, j) );
    Acb_ObjSuppMin( p, iObj );
}